

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGroup.c
# Opt level: O1

int ddGroupSiftingDown(DdManager *table,int x,int xHigh,DD_CHKFP checkFunction,Move **moves)

{
  int x_00;
  uint uVar1;
  DdHalfWord DVar2;
  DdSubtable *pDVar3;
  Move *pMVar4;
  Move *pMVar5;
  int iVar6;
  int iVar7;
  DdHalfWord y;
  int iVar8;
  DdNode *pDVar9;
  DdHalfWord x_01;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  int local_6c;
  int local_68;
  
  pDVar3 = table->subtables;
  uVar10 = (ulong)(uint)x;
  while (pDVar3[(int)uVar10].keys == 1) {
    uVar10 = (ulong)(int)pDVar3[(int)uVar10].next;
    if (pDVar3[uVar10].next == x) {
      return 1;
    }
  }
  x_00 = table->invperm[x];
  uVar1 = pDVar3[x].next;
  iVar6 = table->keys - table->isolated;
  local_68 = 0;
  if ((int)uVar1 < xHigh) {
    lVar11 = (long)xHigh;
    lVar12 = lVar11 * 0xe + 4;
    local_68 = 0;
    do {
      iVar8 = table->invperm[lVar11];
      if ((iVar8 == x_00) || (iVar7 = cuddTestInteract(table,x_00,iVar8), iVar7 != 0)) {
        local_68 = (local_68 - (uint)(table->vars[iVar8]->ref == 1)) +
                   *(int *)((long)&table->subtables->nodelist + lVar12 * 4);
      }
      lVar11 = lVar11 + -1;
      lVar12 = lVar12 + -0xe;
    } while ((int)uVar1 < lVar11);
  }
  y = cuddNextHigh(table,x);
  if (xHigh < (int)y) {
    return 1;
  }
  local_6c = iVar6;
  if (local_68 < 1) {
    return 1;
  }
  do {
    DVar2 = table->subtables[(int)y].next;
    do {
      x_01 = DVar2;
      lVar11 = (long)(int)x_01;
      DVar2 = table->subtables[lVar11].next;
    } while (DVar2 != y);
    iVar8 = (*checkFunction)(table,x,y);
    pDVar3 = table->subtables;
    DVar2 = pDVar3[x].next;
    if (iVar8 == 0) {
      if ((DVar2 == x) && (pDVar3[(int)y].next == y)) {
        iVar8 = table->invperm[(int)y];
        iVar7 = cuddTestInteract(table,x_00,iVar8);
        if (iVar7 != 0) {
          local_68 = (local_68 + (uint)(table->vars[iVar8]->ref == 1)) -
                     table->subtables[(int)y].keys;
        }
        local_6c = cuddSwapInPlace(table,x,y);
        if ((local_6c == 0) || (pDVar9 = cuddDynamicAllocNode(table), pDVar9 == (DdNode *)0x0)) {
LAB_00924996:
          pMVar5 = *moves;
          while (pMVar5 != (Move *)0x0) {
            pMVar4 = pMVar5->next;
            pMVar5->y = 0;
            *(DdNode **)&pMVar5->flags = table->nextFree;
            table->nextFree = (DdNode *)*moves;
            *moves = pMVar4;
            pMVar5 = pMVar4;
          }
          return 0;
        }
        pDVar9->index = x;
        pDVar9->ref = y;
        *(undefined4 *)&pDVar9->next = 0;
        *(int *)((long)&pDVar9->next + 4) = local_6c;
        (pDVar9->type).kids.T = (DdNode *)*moves;
        *moves = (Move *)pDVar9;
        if ((double)iVar6 * table->maxGrowth < (double)local_6c) {
          return 1;
        }
        if (local_6c < iVar6) {
          iVar6 = local_6c;
        }
        cuddNextHigh(table,y);
      }
      else {
        lVar13 = (long)(int)DVar2;
        lVar12 = lVar13 * 0xe + 0x12;
        do {
          iVar8 = table->invperm[lVar13 + 1];
          if ((iVar8 == x_00) || (iVar7 = cuddTestInteract(table,x_00,iVar8), iVar7 != 0)) {
            local_68 = (local_68 + (uint)(table->vars[iVar8]->ref == 1)) -
                       *(int *)((long)&table->subtables->nodelist + lVar12 * 4);
          }
          lVar13 = lVar13 + 1;
          lVar12 = lVar12 + 0xe;
        } while (lVar13 < lVar11);
        local_6c = ddGroupMove(table,x,y,moves);
        if (local_6c == 0) goto LAB_00924996;
        if ((double)iVar6 * table->maxGrowth < (double)local_6c) {
          return 1;
        }
        if (local_6c < iVar6) {
          iVar6 = local_6c;
        }
        uVar1 = table->subtables[lVar11].next;
        lVar12 = (long)(int)uVar1;
        if ((int)uVar1 < (int)x_01) {
          lVar13 = lVar12 * 0xe + 0x12;
          do {
            iVar8 = table->invperm[lVar12 + 1];
            if ((iVar8 == x_00) || (iVar7 = cuddTestInteract(table,x_00,iVar8), iVar7 != 0)) {
              local_68 = (local_68 - (uint)(table->vars[iVar8]->ref == 1)) +
                         *(int *)((long)&table->subtables->nodelist + lVar13 * 4);
            }
            lVar12 = lVar12 + 1;
            lVar13 = lVar13 + 0xe;
          } while (lVar11 != lVar12);
        }
      }
    }
    else {
      pDVar3[x].next = y;
      pDVar3[lVar11].next = DVar2;
      pDVar9 = cuddDynamicAllocNode(table);
      if (pDVar9 == (DdNode *)0x0) goto LAB_00924996;
      pDVar9->index = x;
      pDVar9->ref = y;
      *(undefined4 *)&pDVar9->next = 8;
      *(uint *)((long)&pDVar9->next + 4) = table->keys - table->isolated;
      (pDVar9->type).kids.T = (DdNode *)*moves;
      *moves = (Move *)pDVar9;
    }
    y = cuddNextHigh(table,x_01);
    if ((xHigh < (int)y) || (x = x_01, iVar6 <= local_6c - local_68)) {
      return 1;
    }
  } while( true );
}

Assistant:

static int
ddGroupSiftingDown(
  DdManager * table,
  int  x,
  int  xHigh,
  DD_CHKFP checkFunction,
  Move ** moves)
{
    Move *move;
    int  y;
    int  size;
    int  limitSize;
    int  gxtop,gybot;
    int  R;     /* upper bound on node decrease */
    int  xindex, yindex;
    int  isolated, allVars;
    int  z;
    int  zindex;
#ifdef DD_DEBUG
    int  checkR;
#endif

    /* If the group consists of simple variables, there is no point in
    ** sifting it down. This check is redundant if the projection functions
    ** do not have external references, because the computation of the
    ** lower bound takes care of the problem.  It is necessary otherwise to
    ** prevent the sifting down of simple variables. */
    y = x;
    allVars = 1;
    do {
        if (table->subtables[y].keys != 1) {
            allVars = 0;
            break;
        }
        y = table->subtables[y].next;
    } while (table->subtables[y].next != (unsigned) x);
    if (allVars)
        return(1);

    /* Initialize R. */
    xindex = table->invperm[x];
    gxtop = table->subtables[x].next;
    limitSize = size = table->keys - table->isolated;
    R = 0;
    for (z = xHigh; z > gxtop; z--) {
        zindex = table->invperm[z];
        if (zindex == xindex || cuddTestInteract(table,xindex,zindex)) {
            isolated = table->vars[zindex]->ref == 1;
            R += table->subtables[z].keys - isolated;
        }
    }

    y = cuddNextHigh(table,x);
    while (y <= xHigh && size - R < limitSize) {
#ifdef DD_DEBUG
        gxtop = table->subtables[x].next;
        checkR = 0;
        for (z = xHigh; z > gxtop; z--) {
            zindex = table->invperm[z];
            if (zindex == xindex || cuddTestInteract(table,xindex,zindex)) {
                isolated = table->vars[zindex]->ref == 1;
                checkR += table->subtables[z].keys - isolated;
            }
        }
        assert(R >= checkR);
#endif
        /* Find bottom of y group. */
        gybot = table->subtables[y].next;
        while (table->subtables[gybot].next != (unsigned) y)
            gybot = table->subtables[gybot].next;

        if (checkFunction(table,x,y)) {
            /* Group found: attach groups and record move. */
            gxtop = table->subtables[x].next;
            table->subtables[x].next = y;
            table->subtables[gybot].next = gxtop;
            move = (Move *)cuddDynamicAllocNode(table);
            if (move == NULL) goto ddGroupSiftingDownOutOfMem;
            move->x = x;
            move->y = y;
            move->flags = MTR_NEWNODE;
            move->size = table->keys - table->isolated;
            move->next = *moves;
            *moves = move;
        } else if (table->subtables[x].next == (unsigned) x &&
                   table->subtables[y].next == (unsigned) y) {
            /* x and y are self groups */
            /* Update upper bound on node decrease. */
            yindex = table->invperm[y];
            if (cuddTestInteract(table,xindex,yindex)) {
                isolated = table->vars[yindex]->ref == 1;
                R -= table->subtables[y].keys - isolated;
            }
            size = cuddSwapInPlace(table,x,y);
#ifdef DD_DEBUG
            assert(table->subtables[x].next == (unsigned) x);
            assert(table->subtables[y].next == (unsigned) y);
#endif
            if (size == 0) goto ddGroupSiftingDownOutOfMem;

            /* Record move. */
            move = (Move *) cuddDynamicAllocNode(table);
            if (move == NULL) goto ddGroupSiftingDownOutOfMem;
            move->x = x;
            move->y = y;
            move->flags = MTR_DEFAULT;
            move->size = size;
            move->next = *moves;
            *moves = move;

#ifdef DD_DEBUG
            if (pr > 0) (void) fprintf(table->out,
                                       "ddGroupSiftingDown (2 single groups):\n");
#endif
            if ((double) size > (double) limitSize * table->maxGrowth)
                return(1);
            if (size < limitSize) limitSize = size;

            x = y;
            y = cuddNextHigh(table,x);
        } else { /* Group move */
            /* Update upper bound on node decrease: first phase. */
            gxtop = table->subtables[x].next;
            z = gxtop + 1;
            do {
                zindex = table->invperm[z];
                if (zindex == xindex || cuddTestInteract(table,xindex,zindex)) {
                    isolated = table->vars[zindex]->ref == 1;
                    R -= table->subtables[z].keys - isolated;
                }
                z++;
            } while (z <= gybot);
            size = ddGroupMove(table,x,y,moves);
            if (size == 0) goto ddGroupSiftingDownOutOfMem;
            if ((double) size > (double) limitSize * table->maxGrowth)
                return(1);
            if (size < limitSize) limitSize = size;

            /* Update upper bound on node decrease: second phase. */
            gxtop = table->subtables[gybot].next;
            for (z = gxtop + 1; z <= gybot; z++) {
                zindex = table->invperm[z];
                if (zindex == xindex || cuddTestInteract(table,xindex,zindex)) {
                    isolated = table->vars[zindex]->ref == 1;
                    R += table->subtables[z].keys - isolated;
                }
            }
        }
        x = gybot;
        y = cuddNextHigh(table,x);
    }

    return(1);

ddGroupSiftingDownOutOfMem:
    while (*moves != NULL) {
        move = (*moves)->next;
        cuddDeallocMove(table, *moves);
        *moves = move;
    }

    return(0);

}